

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geopolySvgFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  GeoPoly *pGVar1;
  sqlite3_context *pCtx;
  int *in_RDX;
  int in_ESI;
  sqlite3_context *in_RDI;
  char *z;
  char cSep;
  int i;
  sqlite3_str *x;
  sqlite3 *db;
  GeoPoly *p;
  sqlite3_str *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  int iVar3;
  sqlite3 *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((0 < in_ESI) &&
     (pGVar1 = geopolyFuncParam(in_RDI,(sqlite3_value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                                in_RDX), pGVar1 != (GeoPoly *)0x0)) {
    sqlite3_context_db_handle(in_RDI);
    pCtx = (sqlite3_context *)sqlite3_str_new(in_stack_ffffffffffffffd0);
    uVar2 = CONCAT13(0x27,(int3)in_stack_ffffffffffffffc8);
    sqlite3_str_appendf((StrAccum *)pCtx,"<polyline points=");
    for (iVar3 = 0; iVar3 < pGVar1->nVertex; iVar3 = iVar3 + 1) {
      sqlite3_str_appendf((StrAccum *)(double)pGVar1->a[iVar3 << 1],
                          (char *)(double)pGVar1->a[iVar3 * 2 + 1],pCtx,"%c%g,%g",
                          (ulong)(uint)(int)(char)((uint)uVar2 >> 0x18));
      uVar2 = CONCAT13(0x20,(int3)uVar2);
    }
    sqlite3_str_appendf((StrAccum *)(double)pGVar1->a[0],(char *)(double)pGVar1->a[1],pCtx,
                        " %g,%g\'");
    for (iVar3 = 1; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
      in_stack_ffffffffffffffc0 = (sqlite3_str *)sqlite3_value_text((sqlite3_value *)0x29fe2c);
      if ((in_stack_ffffffffffffffc0 != (sqlite3_str *)0x0) &&
         (*(uchar *)&in_stack_ffffffffffffffc0->db != '\0')) {
        sqlite3_str_appendf((StrAccum *)pCtx," %s",in_stack_ffffffffffffffc0);
      }
    }
    sqlite3_str_appendf((StrAccum *)pCtx,"></polyline>");
    sqlite3_str_finish(in_stack_ffffffffffffffc0);
    sqlite3_result_text(pCtx,(char *)CONCAT44(iVar3,uVar2),
                        (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                        (_func_void_void_ptr *)in_RDI);
    sqlite3_free((void *)0x29feb5);
  }
  return;
}

Assistant:

static void geopolySvgFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p;
  if( argc<1 ) return;
  p = geopolyFuncParam(context, argv[0], 0);
  if( p ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    sqlite3_str *x = sqlite3_str_new(db);
    int i;
    char cSep = '\'';
    sqlite3_str_appendf(x, "<polyline points=");
    for(i=0; i<p->nVertex; i++){
      sqlite3_str_appendf(x, "%c%g,%g", cSep, GeoX(p,i), GeoY(p,i));
      cSep = ' ';
    }
    sqlite3_str_appendf(x, " %g,%g'", GeoX(p,0), GeoY(p,0));
    for(i=1; i<argc; i++){
      const char *z = (const char*)sqlite3_value_text(argv[i]);
      if( z && z[0] ){
        sqlite3_str_appendf(x, " %s", z);
      }
    }
    sqlite3_str_appendf(x, "></polyline>");
    sqlite3_result_text(context, sqlite3_str_finish(x), -1, sqlite3_free);
    sqlite3_free(p);
  }
}